

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ps.c
# Opt level: O0

int bp_decode_ps(mod2sparse *H,char *synd,double error_prob,int max_iter,int *converge,int *iter,
                char *decoding,double *log_prob_ratios)

{
  int iVar1;
  void *__ptr;
  double *in_RCX;
  int in_EDX;
  long in_RSI;
  mod2sparse *in_RDI;
  int *in_R8;
  char *in_R9;
  mod2sparse *in_XMM0_Qa;
  double *in_stack_00000008;
  int check_no;
  char *candidate_synd;
  int hamming_weight;
  int it;
  int N;
  int M;
  char *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int local_50;
  int local_4c;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar1 = in_RDI->n_rows;
  __ptr = chk_alloc(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  bp_setup_ps(in_RDI,(double)in_XMM0_Qa,in_stack_00000008,in_R9);
  local_4c = 0;
  while( true ) {
    if (in_EDX <= local_4c) {
      free(__ptr);
      *in_R8 = local_4c;
      *(undefined4 *)in_RCX = 0;
      return 0;
    }
    bp_update_ps(in_XMM0_Qa,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),in_RCX,
                 (int)((ulong)in_R8 >> 0x20),in_R9);
    syndrome((mod2sparse *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,(char *)0x16dbe7);
    local_50 = 0;
    for (in_stack_ffffffffffffffa4 = 0; (int)in_stack_ffffffffffffffa4 < iVar1;
        in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
      local_50 = (char)(*(byte *)(in_RSI + (int)in_stack_ffffffffffffffa4) ^
                       *(byte *)((long)__ptr + (long)(int)in_stack_ffffffffffffffa4)) + local_50;
    }
    if (local_50 == 0) break;
    local_4c = local_4c + 1;
  }
  free(__ptr);
  *in_R8 = local_4c;
  *(undefined4 *)in_RCX = 1;
  return 1;
}

Assistant:

int bp_decode_ps(
mod2sparse *H,
char *synd,
double error_prob,
int max_iter,
int *converge,
int *iter,
char *decoding,
double *log_prob_ratios)
  {

    int M,N;
    int it;
    M = mod2sparse_rows(H);
    N = mod2sparse_cols(H);
    int hamming_weight;
    char *candidate_synd;

    candidate_synd=chk_alloc(M,sizeof(*candidate_synd));

    bp_setup_ps(H,error_prob,log_prob_ratios,decoding);

    for(it=0; it<max_iter;it++)
      {
        bp_update_ps(H,synd, log_prob_ratios, it, decoding);
        syndrome(H,decoding,candidate_synd);

        //check hamming weight between candidate syndrome and target syndrome
        hamming_weight=0;
        for(int check_no=0;check_no<M;check_no++)
          {
            hamming_weight+=synd[check_no]^candidate_synd[check_no];
          }

        //exit if candidate syndrome has converged to the target solution
        if(hamming_weight==0)
          {
            free(candidate_synd);
            *iter=it;
            *converge=1;
            return 1;
          }


      }
 
    free(candidate_synd);
    *iter=it;
    *converge=0;
    return 0;
  }